

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_mult_m0m1m0(REF_DBL *m1,REF_DBL *m2,REF_DBL *m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  REF_DBL product [9];
  REF_DBL *m_local;
  REF_DBL *m2_local;
  REF_DBL *m1_local;
  
  dVar19 = m1[2] * m2[2] + *m1 * *m2 + m1[1] * m2[1];
  dVar20 = m1[4] * m2[2] + m1[1] * *m2 + m1[3] * m2[1];
  dVar1 = m1[2];
  dVar2 = *m2;
  dVar3 = m1[4];
  dVar4 = m2[1];
  dVar5 = m1[5];
  dVar6 = m2[2];
  dVar21 = m1[2] * m2[4] + *m1 * m2[1] + m1[1] * m2[3];
  dVar22 = m1[4] * m2[4] + m1[1] * m2[1] + m1[3] * m2[3];
  dVar7 = m1[2];
  dVar8 = m2[1];
  dVar9 = m1[4];
  dVar10 = m2[3];
  dVar11 = m1[5];
  dVar12 = m2[4];
  dVar23 = m1[2] * m2[5] + *m1 * m2[2] + m1[1] * m2[4];
  dVar24 = m1[4] * m2[5] + m1[1] * m2[2] + m1[3] * m2[4];
  dVar13 = m1[2];
  dVar14 = m2[2];
  dVar15 = m1[4];
  dVar16 = m2[4];
  dVar17 = m1[5];
  dVar18 = m2[5];
  *m = dVar23 * m1[2] + dVar19 * *m1 + dVar21 * m1[1];
  m[1] = dVar23 * m1[4] + dVar19 * m1[1] + dVar21 * m1[3];
  m[2] = dVar23 * m1[5] + dVar19 * m1[2] + dVar21 * m1[4];
  m[3] = dVar24 * m1[4] + dVar20 * m1[1] + dVar22 * m1[3];
  m[4] = dVar24 * m1[5] + dVar20 * m1[2] + dVar22 * m1[4];
  m[5] = (dVar17 * dVar18 + dVar13 * dVar14 + dVar15 * dVar16) * m1[5] +
         (dVar5 * dVar6 + dVar1 * dVar2 + dVar3 * dVar4) * m1[2] +
         (dVar11 * dVar12 + dVar7 * dVar8 + dVar9 * dVar10) * m1[4];
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_mult_m0m1m0(REF_DBL *m1, REF_DBL *m2,
                                          REF_DBL *m) {
  REF_DBL product[9];
  /* first col */
  product[0] = m1[0] * m2[0] + m1[1] * m2[1] + m1[2] * m2[2];
  product[1] = m1[1] * m2[0] + m1[3] * m2[1] + m1[4] * m2[2];
  product[2] = m1[2] * m2[0] + m1[4] * m2[1] + m1[5] * m2[2];

  /* mid col */
  product[3] = m1[0] * m2[1] + m1[1] * m2[3] + m1[2] * m2[4];
  product[4] = m1[1] * m2[1] + m1[3] * m2[3] + m1[4] * m2[4];
  product[5] = m1[2] * m2[1] + m1[4] * m2[3] + m1[5] * m2[4];

  /* last col */
  product[6] = m1[0] * m2[2] + m1[1] * m2[4] + m1[2] * m2[5];
  product[7] = m1[1] * m2[2] + m1[3] * m2[4] + m1[4] * m2[5];
  product[8] = m1[2] * m2[2] + m1[4] * m2[4] + m1[5] * m2[5];

  m[0] = product[0] * m1[0] + product[3] * m1[1] + product[6] * m1[2];
  m[1] = product[0] * m1[1] + product[3] * m1[3] + product[6] * m1[4];
  m[2] = product[0] * m1[2] + product[3] * m1[4] + product[6] * m1[5];
  m[3] = product[1] * m1[1] + product[4] * m1[3] + product[7] * m1[4];
  m[4] = product[1] * m1[2] + product[4] * m1[4] + product[7] * m1[5];
  m[5] = product[2] * m1[2] + product[5] * m1[4] + product[8] * m1[5];

  return REF_SUCCESS;
}